

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_radio_interface.c
# Opt level: O1

void dlep_radio_interface_cleanup(void)

{
  list_entity *plVar1;
  list_entity *plVar2;
  avl_tree *paVar3;
  list_entity *plVar4;
  list_entity *plVar5;
  
  paVar3 = dlep_if_get_tree(true);
  plVar4 = (paVar3->list_head).next;
  plVar5 = plVar4->next;
  plVar1 = plVar4->prev;
  paVar3 = dlep_if_get_tree(true);
  if (plVar1 != (paVar3->list_head).prev) {
    do {
      dlep_radio_remove_interface((dlep_radio_if *)(plVar4 + -0xb5));
      plVar1 = plVar5->next;
      plVar2 = plVar5->prev;
      paVar3 = dlep_if_get_tree(true);
      plVar4 = plVar5;
      plVar5 = plVar1;
    } while (plVar2 != (paVar3->list_head).prev);
  }
  oonf_class_remove(&_interface_class);
  dlep_radio_session_cleanup();
  dlep_extension_cleanup();
  return;
}

Assistant:

void
dlep_radio_interface_cleanup(void) {
  struct dlep_radio_if *interf, *it;

  avl_for_each_element_safe(dlep_if_get_tree(true), interf, interf._node, it) {
    dlep_radio_remove_interface(interf);
  }

  oonf_class_remove(&_interface_class);
  dlep_radio_session_cleanup();
  dlep_extension_cleanup();
}